

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O1

void __thiscall QWidgetPrivate::hide_helper(QWidgetPrivate *this)

{
  long *plVar1;
  long *plVar2;
  byte bVar3;
  uint uVar4;
  QWidget *popup;
  long lVar5;
  QGraphicsProxyWidget *pQVar6;
  QWidget *pQVar7;
  long lVar8;
  short sVar9;
  uint uVar10;
  QWidgetRepaintManager *this_00;
  long in_FS_OFFSET;
  bool bVar11;
  undefined1 *local_58;
  undefined1 *puStack_50;
  code *local_48;
  undefined8 uStack_40;
  QWidget *local_38;
  undefined8 uStack_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  popup = *(QWidget **)&this->field_0x8;
  uVar4 = (popup->data->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
          super_QFlagsStorage<Qt::WindowType>.i;
  uVar10 = uVar4 & 0xff;
  if ((uVar4 & 1) == 0) {
LAB_0030a362:
    if (uVar10 != 9) goto LAB_0030a396;
  }
  else {
    bVar11 = popup != (QWidget *)0x0;
    if (bVar11) {
      bVar3 = *(byte *)((long)&(popup->data->window_flags).
                               super_QFlagsStorageHelper<Qt::WindowType,_4>.
                               super_QFlagsStorage<Qt::WindowType>.i + 3);
      pQVar7 = popup;
      while ((bVar3 & 0x20) == 0) {
        pQVar7 = *(QWidget **)(*(long *)&pQVar7->field_0x8 + 0x10);
        bVar11 = pQVar7 != (QWidget *)0x0;
        if (pQVar7 == (QWidget *)0x0) break;
        bVar3 = *(byte *)((long)&(pQVar7->data->window_flags).
                                 super_QFlagsStorageHelper<Qt::WindowType,_4>.
                                 super_QFlagsStorage<Qt::WindowType>.i + 3);
      }
    }
    if (bVar11) goto LAB_0030a362;
    pQVar6 = nearestGraphicsProxyWidget(*(QWidget **)(*(long *)&popup->field_0x8 + 0x10));
    if ((uVar10 != 9) || (pQVar6 != (QGraphicsProxyWidget *)0x0)) goto LAB_0030a396;
  }
  QApplicationPrivate::closePopup(*(QApplicationPrivate **)(QCoreApplication::self + 8),popup);
LAB_0030a396:
  uVar4 = popup->data->widget_attributes;
  if ((uVar4 >> 0xb & 1) != 0) {
    popup->data->widget_attributes = uVar4 & 0xfffff7ff;
  }
  hide_sys(this);
  uVar4 = popup->data->widget_attributes;
  sVar9 = (short)uVar4;
  if (sVar9 < 0) {
    popup->data->widget_attributes = uVar4 & 0xffff7fff;
    local_58 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
    QHideEvent::QHideEvent((QHideEvent *)&local_58);
    QCoreApplication::sendEvent(&popup->super_QObject,(QEvent *)&local_58);
    hideChildren(this,false);
    QApplicationPrivate::sendSyntheticEnterLeave
              (*(QApplicationPrivate **)(QCoreApplication::self + 8),popup);
    pQVar7 = QApplication::focusWidget();
    while( true ) {
      if ((pQVar7 == (QWidget *)0x0) ||
         (((pQVar7->data->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
           super_QFlagsStorage<Qt::WindowType>.i & 1) != 0)) goto LAB_0030a3eb;
      if (pQVar7 == popup) break;
      pQVar7 = *(QWidget **)(*(long *)&pQVar7->field_0x8 + 0x10);
    }
    (**(code **)(*(long *)popup + 0x198))(popup,1);
  }
  else {
    local_58 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
    QHideEvent::QHideEvent((QHideEvent *)&local_58);
    QCoreApplication::sendEvent(&popup->super_QObject,(QEvent *)&local_58);
    hideChildren(this,false);
  }
LAB_0030a3eb:
  lVar8 = *(long *)&this->field_0x8;
  do {
    plVar1 = (long *)(lVar8 + 8);
    lVar5 = *(long *)(*plVar1 + 0x10);
    if (lVar5 == 0) break;
    plVar2 = (long *)(lVar8 + 0x20);
    lVar8 = lVar5;
  } while ((*(uint *)(*plVar2 + 0xc) & 1) == 0);
  lVar8 = *(long *)(*plVar1 + 0x78);
  if (lVar8 == 0) {
    lVar8 = 0;
  }
  else {
    lVar8 = *(long *)(lVar8 + 8);
  }
  if (lVar8 == 0) {
    this_00 = (QWidgetRepaintManager *)0x0;
  }
  else {
    this_00 = *(QWidgetRepaintManager **)(lVar8 + 8);
  }
  if (this_00 != (QWidgetRepaintManager *)0x0) {
    QWidgetRepaintManager::removeDirtyWidget(this_00,popup);
  }
  if (sVar9 < 0) {
    local_48 = QFont::strikeOut;
    uStack_40 = 0xaaaaaaaa00008003;
    uStack_30 = 0xaaaaaaaaffffffff;
    local_38 = popup;
    QAccessible::updateAccessibility((QAccessibleEvent *)&local_48);
    QAccessibleEvent::~QAccessibleEvent((QAccessibleEvent *)&local_48);
  }
  QHideEvent::~QHideEvent((QHideEvent *)&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QWidgetPrivate::hide_helper()
{
    Q_Q(QWidget);

    bool isEmbedded = false;
#if QT_CONFIG(graphicsview)
    isEmbedded = q->isWindow() && !bypassGraphicsProxyWidget(q) && nearestGraphicsProxyWidget(q->parentWidget()) != nullptr;
#else
    Q_UNUSED(isEmbedded);
#endif

    if (!isEmbedded && (q->windowType() == Qt::Popup))
        qApp->d_func()->closePopup(q);

    q->setAttribute(Qt::WA_Mapped, false);
    hide_sys();

    bool wasVisible = q->testAttribute(Qt::WA_WState_Visible);

    if (wasVisible) {
        q->setAttribute(Qt::WA_WState_Visible, false);

    }

    QHideEvent hideEvent;
    QCoreApplication::sendEvent(q, &hideEvent);
    hideChildren(false);

    // next bit tries to move the focus if the focus widget is now
    // hidden.
    if (wasVisible) {
        qApp->d_func()->sendSyntheticEnterLeave(q);
        QWidget *fw = QApplication::focusWidget();
        while (fw &&  !fw->isWindow()) {
            if (fw == q) {
                q->focusNextPrevChild(true);
                break;
            }
            fw = fw->parentWidget();
        }
    }

    if (QWidgetRepaintManager *repaintManager = maybeRepaintManager())
        repaintManager->removeDirtyWidget(q);

#if QT_CONFIG(accessibility)
    if (wasVisible) {
        QAccessibleEvent event(q, QAccessible::ObjectHide);
        QAccessible::updateAccessibility(&event);
    }
#endif
}